

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::
parse_key_value_pair<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
          (result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc,size_t n_rec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  const_iterator rollback;
  const_iterator rollback_00;
  EVP_PKEY_CTX EVar3;
  value_type *__x;
  value_type *__y;
  error_type *peVar4;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var5;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var6;
  error_type *peVar7;
  string *psVar8;
  EVP_PKEY_CTX *ctx;
  detail *ctx_00;
  long lVar9;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  allocator_type local_32d;
  allocator_type local_32c;
  allocator_type local_32b;
  allocator<char> local_32a;
  allocator<char> local_329;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  string local_308;
  string msg_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  string local_2a8;
  result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  val;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [9];
  result<toml::detail::region,_toml::detail::none_t> keyval_sep;
  result<toml::detail::region,_toml::detail::none_t> kvsp;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  key_reg;
  
  rollback._M_current = *(char **)(this + 0x40);
  parse_key_abi_cxx11_(&key_reg,this,loc);
  if (key_reg.is_ok_ == false) {
    peVar4 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::unwrap_err(&key_reg);
    std::__cxx11::string::string((string *)&val,(string *)peVar4);
    psVar8 = (string *)this;
    sequence<toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>,_toml::detail::character<'='>,_toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>_>
    ::invoke(&keyval_sep,(location *)this);
    if (keyval_sep.is_ok_ == true) {
      location::reset((location *)this,rollback);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,"toml::parse_key_value_pair: empty key is not allowed.",
                 (allocator<char> *)&local_2c8);
      source_location::source_location((source_location *)&kvsp,(location *)this);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[24],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_238,(source_location *)&kvsp,(char (*) [24])"key expected before \'=\'");
      __l._M_len = 1;
      __l._M_array = (iterator)local_238;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_308,__l,&local_32d);
      local_328.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_328.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_328.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline(&msg_1,&local_2a8,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_308,&local_328,false);
      psVar8 = &msg_1;
      std::__cxx11::string::operator=((string *)&val,(string *)&msg_1);
      std::__cxx11::string::~string((string *)&msg_1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_328);
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_308);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_238);
      source_location::~source_location((source_location *)&kvsp);
      std::__cxx11::string::~string((string *)&local_2a8);
    }
    result<toml::detail::region,_toml::detail::none_t>::cleanup(&keyval_sep,(EVP_PKEY_CTX *)psVar8);
    local_238._0_8_ = local_228;
    puVar2 = (undefined1 *)((long)&val.field_1 + 8);
    if ((undefined1 *)val._0_8_ == puVar2) {
      local_228[0]._8_8_ = val.field_1._16_8_;
    }
    else {
      local_238._0_8_ = val._0_8_;
    }
    local_228[0]._1_7_ = val.field_1.fail.value._M_string_length._1_7_;
    local_228[0]._0_1_ = val.field_1.fail.value._M_string_length._0_1_;
    local_238._8_8_ = val.field_1.fail.value._M_dataplus._M_p;
    val.field_1.fail.value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
    val.field_1.fail.value._M_string_length._0_1_ = 0;
    ctx = (EVP_PKEY_CTX *)local_238;
    val._0_8_ = puVar2;
    result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,(failure_type *)local_238);
    std::__cxx11::string::~string((string *)local_238);
    std::__cxx11::string::~string((string *)&val);
  }
  else {
    sequence<toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>,_toml::detail::character<'='>,_toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>_>
    ::invoke(&kvsp,(location *)this);
    if (kvsp.is_ok_ == false) {
      paVar1 = &msg_1.field_2;
      msg_1._M_string_length = 0;
      msg_1.field_2._M_local_buf[0] = '\0';
      local_238[0] = (EVP_PKEY_CTX)0xa;
      msg_1._M_dataplus._M_p = (pointer)paVar1;
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (*(undefined8 *)(this + 0x40),*(undefined8 *)(*(long *)(this + 8) + 8));
      local_238[0] = (EVP_PKEY_CTX)0x3d;
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (*(undefined8 *)(this + 0x40),_Var5._M_current);
      if (_Var6._M_current == _Var5._M_current) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,
                   "toml::parse_key_value_pair: missing key-value separator `=`",
                   (allocator<char> *)&local_2c8);
        source_location::source_location((source_location *)&keyval_sep,(location *)this);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[14],_true>
                  ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_238,(source_location *)&keyval_sep,(char (*) [14])"should be `=`");
        __l_03._M_len = 1;
        __l_03._M_array = (iterator)local_238;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_308,__l_03,&local_32d);
        local_328.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_328.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_328.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline((string *)&val,&local_2a8,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_308,&local_328,false);
        std::__cxx11::string::operator=((string *)&msg_1,(string *)&val);
        std::__cxx11::string::~string((string *)&val);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_328);
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_308);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_238);
        source_location::~source_location((source_location *)&keyval_sep);
        psVar8 = &local_2a8;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_308,"toml::parse_key_value_pair: invalid format for key",
                   (allocator<char> *)&local_32d);
        source_location::source_location((source_location *)&keyval_sep,(location *)this);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[25],_true>
                  ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_238,(source_location *)&keyval_sep,
                   (char (*) [25])"invalid character in key");
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)local_238;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_328,__l_00,&local_32c);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&val,"Did you forget \'.\' to separate dotted-key?",&local_329);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&val.field_1.succ.value.field_1.string_.str._M_string_length,
                   "Allowed characters for bare key are [0-9a-zA-Z_-].",&local_32a);
        __l_01._M_len = 2;
        __l_01._M_array = (iterator)&val;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_2c8,__l_01,&local_32b);
        format_underline(&local_2a8,&local_308,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_328,&local_2c8,false);
        std::__cxx11::string::operator=((string *)&msg_1,(string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2c8);
        lVar9 = 0x20;
        do {
          std::__cxx11::string::~string((string *)(&val.is_ok_ + lVar9));
          lVar9 = lVar9 + -0x20;
        } while (lVar9 != -0x20);
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_328);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_238);
        source_location::~source_location((source_location *)&keyval_sep);
        psVar8 = &local_308;
      }
      std::__cxx11::string::~string((string *)psVar8);
      location::reset((location *)this,rollback);
      local_238._0_8_ = local_228;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg_1._M_dataplus._M_p == paVar1) {
        local_228[0]._8_8_ = msg_1.field_2._8_8_;
      }
      else {
        local_238._0_8_ = msg_1._M_dataplus._M_p;
      }
      local_228[0]._M_allocated_capacity._1_7_ = msg_1.field_2._M_allocated_capacity._1_7_;
      local_228[0]._M_local_buf[0] = msg_1.field_2._M_local_buf[0];
      local_238._8_8_ = msg_1._M_string_length;
      msg_1._M_string_length = 0;
      msg_1.field_2._M_local_buf[0] = '\0';
      ctx = (EVP_PKEY_CTX *)local_238;
      msg_1._M_dataplus._M_p = (pointer)paVar1;
      result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,(failure_type *)local_238);
      std::__cxx11::string::~string((string *)local_238);
      std::__cxx11::string::~string((string *)&msg_1);
    }
    else {
      rollback_00._M_current = *(char **)(this + 0x40);
      parse_value<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
                (&val,this,loc,n_rec);
      if (val.is_ok_ == false) {
        msg_1._M_dataplus._M_p = (pointer)&msg_1.field_2;
        msg_1._M_string_length = 0;
        msg_1.field_2._M_local_buf[0] = '\0';
        location::reset((location *)this,rollback_00);
        ctx_00 = this;
        sequence<toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>,_toml::detail::maybe<toml::detail::sequence<toml::detail::character<'#'>,_toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::character<'\t'>,_toml::detail::in_range<'_',_'~'>_>,_toml::detail::sequence<toml::detail::in_range<'\xc2',_'\xdf'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<'\xe0'>,_toml::detail::in_range<'\xa0',_'\xbf'>_>,_toml::detail::sequence<toml::detail::in_range<'\xe1',_'\xec'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::character<'\xed'>,_toml::detail::in_range<'\x80',_'\x9f'>_>,_toml::detail::sequence<toml::detail::in_range<'\xee',_'\xef'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<'\xf0'>,_toml::detail::in_range<'\x90',_'\xbf'>_>,_toml::detail::sequence<toml::detail::in_range<'\xf1',_'\xf3'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::character<'\xf4'>,_toml::detail::in_range<'\x80',_'\x8f'>_>_>,_toml::detail::in_range<'\x80',_'\xbf'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>,_toml::detail::unlimited>_>_>,_toml::detail::either<toml::detail::character<'\n'>,_toml::detail::sequence<toml::detail::character<'\r'>,_toml::detail::character<'\n'>_>_>_>
        ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_238,(location *)this);
        EVar3 = local_238[0];
        result<toml::detail::region,_toml::detail::none_t>::cleanup
                  ((result<toml::detail::region,_toml::detail::none_t> *)local_238,
                   (EVP_PKEY_CTX *)ctx_00);
        if (EVar3 == (EVP_PKEY_CTX)0x1) {
          location::reset((location *)this,rollback_00);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_308,
                     "toml::parse_key_value_pair: missing value after key-value separator \'=\'",
                     (allocator<char> *)&local_32d);
          source_location::source_location((source_location *)&keyval_sep,(location *)this);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<toml::source_location,_const_char_(&)[32],_true>
                    ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_238,(source_location *)&keyval_sep,
                     (char (*) [32])"expected value, but got nothing");
          __l_02._M_len = 1;
          __l_02._M_array = (iterator)local_238;
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_328,__l_02,&local_32c);
          local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          format_underline(&local_2a8,&local_308,
                           (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_328,&local_2c8,false);
          std::__cxx11::string::operator=((string *)&msg_1,(string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_2c8);
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&local_328);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_238);
          source_location::~source_location((source_location *)&keyval_sep);
          std::__cxx11::string::~string((string *)&local_308);
        }
        else {
          peVar7 = result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::unwrap_err(&val);
          std::__cxx11::string::operator=((string *)&msg_1,(string *)peVar7);
        }
        location::reset((location *)this,rollback);
        std::__cxx11::string::string((string *)local_238,(string *)&msg_1);
        ctx = (EVP_PKEY_CTX *)local_238;
        result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::result(__return_storage_ptr__,(failure_type *)local_238);
        std::__cxx11::string::~string((string *)local_238);
        std::__cxx11::string::~string((string *)&msg_1);
      }
      else {
        __x = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::unwrap(&key_reg);
        __y = result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::unwrap(&val);
        std::
        pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
        ::
        pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_true>
                  ((pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
                    *)&keyval_sep,__x,__y);
        std::
        pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
        ::pair((pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
                *)local_238,
               (pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
                *)&keyval_sep);
        ctx = (EVP_PKEY_CTX *)local_238;
        result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::result(__return_storage_ptr__,(success_type *)ctx);
        std::
        pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
        ::~pair((pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
                 *)local_238);
        std::
        pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
        ::~pair((pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
                 *)&keyval_sep);
      }
      result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::cleanup(&val,ctx);
    }
    result<toml::detail::region,_toml::detail::none_t>::cleanup(&kvsp,ctx);
  }
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::cleanup(&key_reg,ctx);
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<std::pair<std::vector<key>, region>, Value>, std::string>
parse_key_value_pair(location& loc, const std::size_t n_rec)
{
    using value_type = Value;

    const auto first = loc.iter();
    auto key_reg = parse_key(loc);
    if(!key_reg)
    {
        std::string msg = std::move(key_reg.unwrap_err());
        // if the next token is keyvalue-separator, it means that there are no
        // key. then we need to show error as "empty key is not allowed".
        if(const auto keyval_sep = lex_keyval_sep::invoke(loc))
        {
            loc.reset(first);
            msg = format_underline("toml::parse_key_value_pair: "
                "empty key is not allowed.",
                {{source_location(loc), "key expected before '='"}});
        }
        return err(std::move(msg));
    }

    const auto kvsp = lex_keyval_sep::invoke(loc);
    if(!kvsp)
    {
        std::string msg;
        // if the line contains '=' after the invalid sequence, possibly the
        // error is in the key (like, invalid character in bare key).
        const auto line_end = std::find(loc.iter(), loc.end(), '\n');
        if(std::find(loc.iter(), line_end, '=') != line_end)
        {
            msg = format_underline("toml::parse_key_value_pair: "
                "invalid format for key",
                {{source_location(loc), "invalid character in key"}},
                {"Did you forget '.' to separate dotted-key?",
                "Allowed characters for bare key are [0-9a-zA-Z_-]."});
        }
        else // if not, the error is lack of key-value separator.
        {
            msg = format_underline("toml::parse_key_value_pair: "
                "missing key-value separator `=`",
                {{source_location(loc), "should be `=`"}});
        }
        loc.reset(first);
        return err(std::move(msg));
    }

    const auto after_kvsp = loc.iter(); // err msg
    auto val = parse_value<value_type>(loc, n_rec);
    if(!val)
    {
        std::string msg;
        loc.reset(after_kvsp);
        // check there is something not a comment/whitespace after `=`
        if(sequence<maybe<lex_ws>, maybe<lex_comment>, lex_newline>::invoke(loc))
        {
            loc.reset(after_kvsp);
            msg = format_underline("toml::parse_key_value_pair: "
                    "missing value after key-value separator '='",
                    {{source_location(loc), "expected value, but got nothing"}});
        }
        else // there is something not a comment/whitespace, so invalid format.
        {
            msg = std::move(val.unwrap_err());
        }
        loc.reset(first);
        return err(msg);
    }
    return ok(std::make_pair(std::move(key_reg.unwrap()),
                             std::move(val.unwrap())));
}